

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

lword writesection(GlobalVars *gv,uint8_t *dest,Reloc *r,lword v)

{
  char cVar1;
  ushort uVar2;
  uint be_00;
  uint n;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  long v_00;
  ulong in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  bool bVar6;
  int bsiz;
  int bpos;
  lword oldval;
  lword insval;
  lword mask;
  RelocInsert *ri;
  bool signedval;
  uint8_t t;
  bool be;
  long local_58;
  ulong x;
  undefined8 *local_40;
  
  be_00 = (uint)(*(char *)(in_RDI + 0x21a) != '\0');
  cVar1 = *(char *)(in_RDX + 0x38);
  bVar6 = true;
  if (((((cVar1 != '\x02') && (bVar6 = true, cVar1 != '\x04')) && (bVar6 = true, cVar1 != '\x05'))
      && ((bVar6 = true, cVar1 != '\b' && (bVar6 = true, cVar1 != '\t')))) &&
     ((bVar6 = true, cVar1 != '\n' && ((bVar6 = true, cVar1 != ' ' && (bVar6 = true, cVar1 != '!')))
      ))) {
    bVar6 = cVar1 == '\"';
  }
  if (cVar1 != '\0') {
    for (local_40 = *(undefined8 **)(in_RDX + 0x30); local_40 != (undefined8 *)0x0;
        local_40 = (undefined8 *)*local_40) {
      writereloc(be_00,in_RSI,(uint)*(ushort *)(local_40 + 1),(uint)*(ushort *)((long)local_40 + 10)
                 ,0);
    }
    for (local_40 = *(undefined8 **)(in_RDX + 0x30); local_40 != (undefined8 *)0x0;
        local_40 = (undefined8 *)*local_40) {
      x = local_40[2];
      uVar5 = in_RCX & x;
      uVar2 = *(ushort *)(local_40 + 1);
      n = (uint)*(ushort *)((long)local_40 + 10);
      iVar3 = lshiftcnt(x);
      v_00 = (long)uVar5 >> ((byte)iVar3 & 0x3f);
      if ((-1 < (long)x) && (bVar6)) {
        v_00 = sign_extend(v_00,n);
      }
      bVar4 = checkrange(x,(bool)((ulong)v_00 >> 0x20),(int)v_00);
      if (bVar4 == 0) {
        return v_00;
      }
      local_58 = readreloc(be_00,in_RSI,(uint)uVar2,n);
      if ((-1 < (long)x) && (bVar6)) {
        local_58 = sign_extend(local_58,n);
      }
      writereloc(be_00,in_RSI,(uint)uVar2,n,local_58 + v_00);
    }
  }
  return 0;
}

Assistant:

lword writesection(struct GlobalVars *gv,uint8_t *dest,struct Reloc *r,lword v)
/* Write 'v' into the bit-field defined by the relocation type in 'r'.
   Do range checks first, depending on the reloc type.
   Returns 0 on success or the masked and normalized value which failed
   on the range check. */
{
  bool be = gv->endianess != _LITTLE_ENDIAN_;
  uint8_t t = r->rtype;
  bool signedval = t==R_PC||t==R_GOTPC||t==R_GOTOFF||t==R_PLTPC||t==R_PLTOFF||
                   t==R_SD||t==R_SD2||t==R_SD21||t==R_MOSDREL;
  struct RelocInsert *ri;

  if (t == R_NONE)
    return 0;

  /* Reset all relocation fields to zero. */
  for (ri=r->insert; ri!=NULL; ri=ri->next)
    writereloc(be,dest,ri->bpos,ri->bsiz,0);

  /* add value to relocation fields */
  for (ri=r->insert; ri!=NULL; ri=ri->next) {
    lword mask = ri->mask;
    lword insval = v & mask;
    lword oldval;
    int bpos = ri->bpos;
    int bsiz = ri->bsiz;

    insval >>= lshiftcnt(mask);  /* normalize according mask */
    if (mask>=0 && signedval)
      insval = sign_extend(insval,bsiz);

    if (!checkrange(insval,signedval,bsiz))
      return insval;  /* range check failed on 'insval' */

    /* add to value already present in this field */
    oldval = readreloc(be,dest,bpos,bsiz);
    if (mask>=0 && signedval)
      oldval = sign_extend(oldval,bsiz);
    writereloc(be,dest,bpos,bsiz,oldval+insval);
  }

  return 0;
}